

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructNew *curr)

{
  size_t sVar1;
  Struct *pSVar2;
  pointer pFVar3;
  Literal *pLVar4;
  ulong uVar5;
  Literal *this_00;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  HeapType local_e8;
  HeapType heapType;
  Literal local_c8;
  Literal local_b0;
  undefined1 local_98 [8];
  Literals data;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id == 1) {
    sVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar1 != 0) {
      uVar5 = 0;
      do {
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar5) goto LAB_00d20f9e;
        visit(__return_storage_ptr__,this,
              (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar5]
             );
        if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
          return __return_storage_ptr__;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible)
        ;
        Literal::~Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                          fixed._M_elems);
        uVar5 = uVar5 + 1;
      } while (sVar1 != uVar5);
    }
    handle_unreachable("unreachable but no unreachable child",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                       ,0x6c2);
  }
  data.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type;
  local_e8 = wasm::Type::getHeapType
                       ((Type *)data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar2 = HeapType::getStruct(&local_e8);
  SmallVector<wasm::Literal,_1UL>::SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)local_98,
             (long)(pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4);
  pFVar3 = (pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar3) {
    uVar5 = 1;
    uVar8 = 0;
    do {
      uVar7 = uVar5;
      uVar5 = (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      iVar6 = (int)uVar7;
      if (uVar5 == 0) {
        pLVar4 = (Literal *)&heapType;
        Literal::makeZero(pLVar4,(Type)pFVar3[uVar8].type.id);
        this_00 = (Literal *)
                  ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                  uVar8 * 0x18);
        if (iVar6 == 1) {
          this_00 = (Literal *)&data;
        }
        Literal::operator=(this_00,pLVar4);
      }
      else {
        if (uVar5 <= uVar8) {
LAB_00d20f9e:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        visit(__return_storage_ptr__,this,
              (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar8]
             );
        if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
        goto LAB_00d20f73;
        pLVar4 = Flow::getSingleValue(__return_storage_ptr__);
        Literal::Literal(&local_c8,pLVar4);
        truncateForPacking((Literal *)&heapType,this,&local_c8,pFVar3 + uVar8);
        pLVar4 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 uVar8 * 0x18);
        if (iVar6 == 1) {
          pLVar4 = (Literal *)&data;
        }
        Literal::operator=(pLVar4,(Literal *)&heapType);
        Literal::~Literal((Literal *)&heapType);
        Literal::~Literal(&local_c8);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible)
        ;
        pLVar4 = (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems;
      }
      Literal::~Literal(pLVar4);
      pFVar3 = (pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = (ulong)(iVar6 + 1);
      uVar8 = uVar7;
    } while (uVar7 < (ulong)((long)(pSVar2->fields).
                                   super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 4));
  }
  makeGCData(&local_b0,this,(Literals *)local_98,
             (Type)((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage)->field_0).i64);
  Flow::Flow(__return_storage_ptr__,&local_b0);
  Literal::~Literal(&local_b0);
LAB_00d20f73:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&data);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return makeGCData(std::move(data), curr->type);
  }